

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O0

deBool writeEscaped(qpXmlWriter *writer,char *str)

{
  bool bVar1;
  size_t sVar2;
  char *local_148;
  char *repl;
  char *pcStack_138;
  deBool isEOS;
  char *s;
  char *d;
  char buf [266];
  char *str_local;
  qpXmlWriter *writer_local;
  
  s = (char *)&d;
  bVar1 = false;
  pcStack_138 = str;
  unique0x100000f0 = str;
  do {
    local_148 = (char *)0x0;
    switch(*pcStack_138) {
    case '\0':
      bVar1 = true;
      break;
    case '\x01':
      local_148 = "&lt;SOH&gt;";
      break;
    case '\x02':
      local_148 = "&lt;STX&gt;";
      break;
    case '\x03':
      local_148 = "&lt;ETX&gt;";
      break;
    case '\x04':
      local_148 = "&lt;EOT&gt;";
      break;
    case '\x05':
      local_148 = "&lt;ENQ&gt;";
      break;
    case '\x06':
      local_148 = "&lt;ACK&gt;";
      break;
    case '\a':
      local_148 = "&lt;BEL&gt;";
      break;
    case '\b':
      local_148 = "&lt;BS&gt;";
      break;
    default:
      break;
    case '\v':
      local_148 = "&lt;VT&gt;";
      break;
    case '\f':
      local_148 = "&lt;FF&gt;";
      break;
    case '\x0e':
      local_148 = "&lt;SO&gt;";
      break;
    case '\x0f':
      local_148 = "&lt;SI&gt;";
      break;
    case '\x10':
      local_148 = "&lt;DLE&gt;";
      break;
    case '\x11':
      local_148 = "&lt;DC1&gt;";
      break;
    case '\x12':
      local_148 = "&lt;DC2&gt;";
      break;
    case '\x13':
      local_148 = "&lt;DC3&gt;";
      break;
    case '\x14':
      local_148 = "&lt;DC4&gt;";
      break;
    case '\x15':
      local_148 = "&lt;NAK&gt;";
      break;
    case '\x16':
      local_148 = "&lt;SYN&gt;";
      break;
    case '\x17':
      local_148 = "&lt;ETB&gt;";
      break;
    case '\x18':
      local_148 = "&lt;CAN&gt;";
      break;
    case '\x19':
      local_148 = "&lt;EM&gt;";
      break;
    case '\x1a':
      local_148 = "&lt;SUB&gt;";
      break;
    case '\x1b':
      local_148 = "&lt;ESC&gt;";
      break;
    case '\x1c':
      local_148 = "&lt;FS&gt;";
      break;
    case '\x1d':
      local_148 = "&lt;GS&gt;";
      break;
    case '\x1e':
      local_148 = "&lt;RS&gt;";
      break;
    case '\x1f':
      local_148 = "&lt;US&gt;";
      break;
    case '\"':
      local_148 = "&quot;";
      break;
    case '&':
      local_148 = "&amp;";
      break;
    case '\'':
      local_148 = "&apos;";
      break;
    case '<':
      local_148 = "&lt;";
      break;
    case '>':
      local_148 = "&gt;";
    }
    if (local_148 == (char *)0x0) {
      *s = *pcStack_138;
      s = s + 1;
    }
    else {
      strcpy(s,local_148);
      sVar2 = strlen(local_148);
      s = s + sVar2;
    }
    pcStack_138 = pcStack_138 + 1;
    if ((bVar1) || (3 < (long)s - (long)&d)) {
      *s = '\0';
      fprintf((FILE *)writer->outputFile,"%s",&d);
      s = (char *)&d;
    }
  } while (!bVar1);
  if (writer->flushAfterWrite != 0) {
    fflush((FILE *)writer->outputFile);
  }
  return 1;
}

Assistant:

static deBool writeEscaped (qpXmlWriter* writer, const char* str)
{
	char		buf[256 + 10];
	char*		d		= &buf[0];
	const char*	s		= str;
	deBool		isEOS	= DE_FALSE;

	do
	{
		/* Check for characters that need to be escaped. */
		const char* repl = DE_NULL;
		switch (*s)
		{
			case 0:		isEOS = DE_TRUE;		break;
			case '<':	repl = "&lt;";			break;
			case '>':	repl = "&gt;";			break;
			case '&':	repl = "&amp;";			break;
			case '\'':	repl = "&apos;";		break;
			case '"':	repl = "&quot;";		break;

			/* Non-printable characters. */
			case 1:		repl = "&lt;SOH&gt;";	break;
			case 2:		repl = "&lt;STX&gt;";	break;
			case 3:		repl = "&lt;ETX&gt;";	break;
			case 4:		repl = "&lt;EOT&gt;";	break;
			case 5:		repl = "&lt;ENQ&gt;";	break;
			case 6:		repl = "&lt;ACK&gt;";	break;
			case 7:		repl = "&lt;BEL&gt;";	break;
			case 8:		repl = "&lt;BS&gt;";	break;
			case 11:	repl = "&lt;VT&gt;";	break;
			case 12:	repl = "&lt;FF&gt;";	break;
			case 14:	repl = "&lt;SO&gt;";	break;
			case 15:	repl = "&lt;SI&gt;";	break;
			case 16:	repl = "&lt;DLE&gt;";	break;
			case 17:	repl = "&lt;DC1&gt;";	break;
			case 18:	repl = "&lt;DC2&gt;";	break;
			case 19:	repl = "&lt;DC3&gt;";	break;
			case 20:	repl = "&lt;DC4&gt;";	break;
			case 21:	repl = "&lt;NAK&gt;";	break;
			case 22:	repl = "&lt;SYN&gt;";	break;
			case 23:	repl = "&lt;ETB&gt;";	break;
			case 24:	repl = "&lt;CAN&gt;";	break;
			case 25:	repl = "&lt;EM&gt;";	break;
			case 26:	repl = "&lt;SUB&gt;";	break;
			case 27:	repl = "&lt;ESC&gt;";	break;
			case 28:	repl = "&lt;FS&gt;";	break;
			case 29:	repl = "&lt;GS&gt;";	break;
			case 30:	repl = "&lt;RS&gt;";	break;
			case 31:	repl = "&lt;US&gt;";	break;

			default:	/* nada */				break;
		}

		/* Write out char or escape sequence. */
		if (repl)
		{
			s++;
			strcpy(d, repl);
			d += strlen(repl);
		}
		else
			*d++ = *s++;

		/* Write buffer if EOS or buffer full. */
		if (isEOS || ((d - &buf[0]) >= 4))
		{
			*d = 0;
			fprintf(writer->outputFile, "%s", buf);
			d = &buf[0];
		}
	} while (!isEOS);

	if (writer->flushAfterWrite)
		fflush(writer->outputFile);
	DE_ASSERT(d == &buf[0]); /* buffer must be empty */
	return DE_TRUE;
}